

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::are_equal<char,6ul>
               (char (*expected) [6],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,
               LocationInfo *location)

{
  FailedAssertion *this;
  bool bVar1;
  allocator local_41;
  string local_40;
  LocationInfo *local_20;
  LocationInfo *location_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_local;
  char (*expected_local) [6];
  
  local_20 = location;
  location_local = (LocationInfo *)actual;
  actual_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expected;
  bVar1 = std::operator==(*expected,actual);
  if (!bVar1) {
    this = (FailedAssertion *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Values are not equal!",&local_41);
    FailedAssertion::FailedAssertion(this,&local_40,local_20);
    __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  return;
}

Assistant:

inline void are_equal(const T (&expected)[n], const std::basic_string<T> &actual, const LocationInfo &location)
	{
		if (!(expected == actual))
			throw FailedAssertion("Values are not equal!", location);
	}